

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.h
# Opt level: O1

void __thiscall hwnet::TCPListener::~TCPListener(TCPListener *this)

{
  ~TCPListener(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

~TCPListener(){}